

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O2

void anon_unknown.dwarf_281dd4::check<half>(istream *is,half c)

{
  float *pfVar1;
  float fVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  undefined6 in_register_00000032;
  uchar b [2];
  
  b = SUB82((ulong)in_RAX >> 0x30,0);
  std::istream::read((char *)is,(long)b);
  poVar3 = std::operator<<((ostream *)&std::cout,"4half");
  poVar3 = std::operator<<(poVar3,": expected ");
  poVar3 = (ostream *)
           ::operator<<(poVar3,(half *)(CONCAT62(in_register_00000032,c._h) & 0xffffffff));
  poVar3 = std::operator<<(poVar3,", got ");
  poVar3 = (ostream *)::operator<<(poVar3,(half *)(ulong)(ushort)b);
  std::endl<char,std::char_traits<char>>(poVar3);
  fVar2 = *(float *)((long)&half::_toFloat + (ulong)c._h * 4);
  pfVar1 = (float *)((long)&half::_toFloat + (long)(ulong)(ushort)b * 4);
  if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testXdr.cpp"
                ,0x85,"void (anonymous namespace)::check(istream &, T) [T = half]");
}

Assistant:

void
check (istream &is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid(v).name() << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}